

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall
spatial_region::film
          (spatial_region *this,double x0,double x1,double ne_y0,double ne_y1,int ions,double cmr,
          double gradwidth,double y0,double y1,double z0,double z1,double T,double vx,
          bool is_profiled,int xnpic_film,int ynpic_film,int znpic_film,
          bool append_for_moving_window,double gradwidth_y)

{
  int iVar1;
  double T_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000011;
  int iVar16;
  int i;
  int iVar17;
  ulong uVar18;
  int iVar19;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double cmr_00;
  undefined1 in_register_00001208 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar42 [64];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined8 in_XMM8_Qb;
  int_vector3d local_100;
  int_vector3d local_f4;
  double local_e8;
  double dStack_e0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined4 local_9c;
  undefined1 local_98 [16];
  ulong local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [24];
  
  auVar43._8_56_ = in_register_000012c8;
  auVar43._0_8_ = ne_y1;
  auVar42._8_56_ = in_register_00001288;
  auVar42._0_8_ = ne_y0;
  auVar31._8_56_ = in_register_00001208;
  auVar31._0_8_ = x0;
  local_9c = (undefined4)CONCAT71(in_register_00000011,is_profiled);
  uVar13 = (uint)(x1 / this->dx);
  if (append_for_moving_window) {
    uVar18 = (ulong)(this->nx - 3);
    uVar14 = this->nx - 2;
    local_88 = (ulong)uVar14;
    if ((int)uVar13 < (int)uVar14) {
      local_88 = uVar18;
    }
  }
  else {
    uVar15 = (uint)(x0 / this->dx);
    uVar15 = ~((int)uVar15 >> 0x1f) & uVar15;
    uVar13 = ~((int)uVar13 >> 0x1f) & uVar13;
    uVar14 = this->nx;
    if ((int)uVar14 <= (int)uVar15) {
      uVar15 = uVar14;
    }
    uVar18 = (ulong)uVar15;
    local_88 = (ulong)uVar14;
    if ((int)uVar13 < (int)uVar14) {
      local_88 = (ulong)uVar13;
    }
  }
  dVar20 = this->dy;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = vx;
  auVar44 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar44,auVar44);
  local_80 = auVar44._0_8_;
  local_70 = x0 + gradwidth;
  local_b8 = T * cmr;
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  local_98 = vxorpd_avx512vl(auVar31._0_16_,auVar11);
  local_58 = (double)(((int)(y1 / dVar20) - (int)(y0 / dVar20)) + -3);
  local_78 = x0 - gradwidth;
  local_48._0_16_ = vunpcklpd_avx(auVar43._0_16_,auVar42._0_16_);
  auVar44 = vsqrtsd_avx(auVar44,auVar44);
  local_60 = auVar44._0_8_;
  local_100.i = xnpic_film;
  local_100.j = ynpic_film;
  local_100.k = znpic_film;
  local_d0 = gradwidth;
  local_c0 = cmr;
  local_b0 = y0;
  local_a8 = y1;
  dStack_50 = local_58;
  do {
    iVar17 = (int)uVar18;
    if ((int)local_88 <= iVar17) {
      return;
    }
    local_c8 = (double)iVar17;
    iVar19 = (int)(local_b0 / dVar20);
    while( true ) {
      iVar1 = iVar19 + 1;
      if ((int)(local_a8 / dVar20) + -1 <= iVar1) break;
      auVar44 = vpinsrd_avx(ZEXT416((uint)(iVar19 - (int)(local_b0 / dVar20))),
                            ((int)(local_a8 / dVar20) - iVar19) + -3,1);
      auVar44 = vcvtdq2pd_avx(auVar44);
      auVar22._0_8_ = auVar44._0_8_ * (double)local_48._0_8_;
      auVar22._8_8_ = auVar44._8_8_ * (double)local_48._8_8_;
      auVar12._8_8_ = dStack_50;
      auVar12._0_8_ = local_58;
      auVar44 = vdivpd_avx(auVar22,auVar12);
      local_e8 = auVar44._0_8_ + auVar44._8_8_;
      dStack_e0 = auVar44._0_8_ + auVar44._8_8_;
      dVar20 = this->dz;
      local_68 = (double)iVar1;
      iVar16 = (int)(z0 / dVar20);
      while (iVar16 = iVar16 + 1, iVar16 < (int)(z1 / dVar20) + -1) {
        if ((char)local_9c != '\0') {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = this->dy;
          dVar20 = this->dy * (double)this->ny * 0.5;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_68;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dVar20;
          auVar44 = vfmsub132sd_fma(auVar23,auVar32,auVar2);
          dVar20 = auVar44._0_8_ / dVar20;
          dVar21 = cos(dVar20 * dVar20 * dVar20 * dVar20 * dVar20 * 1.5707963267948966);
          auVar33._0_8_ = (double)iVar16;
          auVar33._8_8_ = in_XMM8_Qb;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = this->dz;
          dVar20 = this->dz * (double)this->nz * 0.5;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = dVar20;
          auVar44 = vfmsub213sd_fma(auVar33,auVar24,auVar40);
          dVar20 = auVar44._0_8_ / dVar20;
          dVar20 = cos(dVar20 * dVar20 * dVar20 * dVar20 * dVar20 * 1.5707963267948966);
          local_e8 = local_e8 * dVar20 * dVar20 * dVar21 * dVar21;
          dStack_e0 = 0.0;
        }
        if (0.0 <= gradwidth_y) {
          dVar20 = this->dy;
          auVar41._0_8_ = (double)(iVar19 - (int)(local_b0 / dVar20));
          auVar41._8_8_ = in_XMM8_Qb;
          auVar25._0_8_ = gradwidth_y / dVar20;
          auVar25._8_8_ = 0;
          uVar9 = vcmpsd_avx512f(auVar41,auVar25,1);
          bVar10 = (bool)((byte)uVar9 & 1);
          local_e8 = (double)((ulong)bVar10 * (long)(local_e8 * (auVar41._0_8_ / auVar25._0_8_)) +
                             (ulong)!bVar10 * (long)local_e8);
          dVar20 = (double)(((int)(local_a8 / dVar20) - iVar19) + -3);
          if (dVar20 < auVar25._0_8_) {
            local_e8 = (dVar20 / auVar25._0_8_) * local_e8;
            dStack_e0 = 0.0;
          }
        }
        dVar20 = local_60;
        local_f4.i = iVar17;
        local_f4.j = iVar1;
        local_f4.k = iVar16;
        if (local_80 < 0.0) {
          dVar20 = sqrt(local_80);
        }
        dVar20 = vx / dVar20;
        dVar21 = this->dx;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar21;
        if (0.0 <= local_d0) {
          if ((int)(local_70 / dVar21) <= iVar17) goto LAB_001107c4;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_c8;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_98._0_8_;
          auVar44 = vfmadd213sd_fma(auVar26,auVar36,auVar5);
          fill_cell_by_particles
                    (this,-1.0,&local_f4,&local_100,(auVar44._0_8_ * local_e8) / local_d0,dVar20,0.0
                     ,0.0,T);
          if (ions == 2) {
            auVar30._8_8_ = 0;
            auVar30._0_8_ = this->dx;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = local_c8;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_98._0_8_;
            auVar44 = vfmadd213sd_fma(auVar30,auVar39,auVar8);
            dVar21 = (auVar44._0_8_ * local_e8) / local_d0;
            goto LAB_001108b9;
          }
          if (ions == 1) {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = this->dx;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_c8;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_98._0_8_;
            auVar44 = vfmadd213sd_fma(auVar28,auVar37,auVar6);
            dVar21 = (auVar44._0_8_ * local_e8) / local_d0;
            T_00 = local_b8;
            cmr_00 = local_c0;
            goto LAB_001108d1;
          }
        }
        else if (iVar17 < (int)(local_78 / dVar21)) {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_c8;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_98._0_8_;
          auVar44 = vfmadd213sd_fma(auVar26,auVar34,auVar3);
          fill_cell_by_particles
                    (this,-1.0,&local_f4,&local_100,(auVar44._0_8_ / local_d0 + 1.0) * local_e8,
                     dVar20,0.0,0.0,T);
          if (ions == 2) {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = this->dx;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = local_c8;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_98._0_8_;
            auVar44 = vfmadd213sd_fma(auVar29,auVar38,auVar7);
            dVar21 = (auVar44._0_8_ / local_d0 + 1.0) * local_e8;
LAB_001108b9:
            T_00 = T;
            cmr_00 = 1.0;
          }
          else {
            if (ions != 1) goto LAB_001108d6;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = this->dx;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = local_c8;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_98._0_8_;
            auVar44 = vfmadd213sd_fma(auVar27,auVar35,auVar4);
            dVar21 = (auVar44._0_8_ / local_d0 + 1.0) * local_e8;
            T_00 = local_b8;
            cmr_00 = local_c0;
          }
LAB_001108d1:
          fill_cell_by_particles(this,cmr_00,&local_f4,&local_100,dVar21,dVar20,0.0,0.0,T_00);
        }
        else {
LAB_001107c4:
          fill_cell_by_particles(this,-1.0,&local_f4,&local_100,local_e8,dVar20,0.0,0.0,T);
          dVar21 = local_e8;
          if (ions == 2) goto LAB_001108b9;
          T_00 = local_b8;
          cmr_00 = local_c0;
          if (ions == 1) goto LAB_001108d1;
        }
LAB_001108d6:
        dVar20 = this->dz;
      }
      dVar20 = this->dy;
      iVar19 = iVar1;
    }
    uVar18 = (ulong)(iVar17 + 1);
  } while( true );
}

Assistant:

void spatial_region::film(double x0, double x1, double ne_y0, double ne_y1, int ions, double
        cmr, double gradwidth, double y0, double y1, double z0, double z1,
        double T, double vx, bool is_profiled,
        int xnpic_film, int ynpic_film, int znpic_film, bool append_for_moving_window, double gradwidth_y)
{ /* x0 - координата левой границы плёнки, x1 - правой, ne -
     концентрация электронов в плёнке, нормированная на критическую
     концентрацию */
    /* gradwidth - толщина части плёнки с линейным ростом плотности от
     * 0 на левой границе плёнки до ne при x0+gradwidth */
    /* при gradwidth<0 плотность плёнки линейно спадает от ne до 0 на
     * участке с градиентом */
    // if is_profiled == 1 then film has transverse envelope
    // ions == 0 - no ions, ions == 1 - use cmr, ions == 2 - positrons

    int_vector3d a,b;
    b.i = xnpic_film;
    b.j = ynpic_film;
    b.k = znpic_film;
    int i0,i1;
    i0 = x0/dx;
    i1 = x1/dx;

    if (append_for_moving_window)
    {
        i0 = nx-3;
        if (i0 < nx-2 && i1 >= nx-2)
        {
            i1 = nx-2;
        }
        else
        {
            i1 = i0; // the for loop is skipped
        }
    }
    else
    {
        if (i0<0) i0 = 0;
        if (i1<0) i1 = 0;
        if (i0>nx) i0 = nx;
        if (i1>nx) i1 = nx;
    }

    double film_ylen = double(int(y1/dy) - int(y0/dy) - 3);
    for(int i=i0;i<i1;i++)
    {
        for(int j=int(y0/dy)+1;j<int(y1/dy)-1;j++)
        {
            double nes = ne_y1 * (j - int(y0/dy) - 1) / film_ylen + ne_y0 * (int(y1/dy) - 2 - j) / film_ylen;
            for(int k=int(z0/dz)+1;k<int(z1/dz)-1;k++)
            {
                if (is_profiled == 1) {
                    double tmp = (j * dy - ny * dy / 2) / (ny * dy / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    double tr_env = tmp * tmp;
                    tmp =  (k * dz - nz * dz / 2) / (nz * dz / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    tr_env *= tmp * tmp;
                    nes *=  tr_env;
                }
                
                if (gradwidth_y >= 0 && j-int(y0/dy)-1 < gradwidth_y/dy) {
                    nes *= (j-int(y0/dy)-1) / (gradwidth_y/dy);
                }
                if (gradwidth_y >= 0 && int(y1/dy)-2-j < gradwidth_y/dy) {
                    nes *= (int(y1/dy)-2-j) / (gradwidth_y/dy);
                }
                //
                a.i = i;
                a.j = j;
                a.k = k;
                double ux0 = vx / sqrt(1 - vx * vx);
                if (gradwidth>=0) {
                    if (i>=int((x0+gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                    }
                } else {
                    if (i>=int((x0-gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                    }
                }
            }
        }
    }
}